

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-type.c
# Opt level: O0

coda_dynamic_type *
coda_cdf_variable_new
          (int32_t data_type,int32_t max_rec,int32_t rec_varys,int32_t num_dims,int32_t *dim,
          int32_t *dim_varys,coda_array_ordering array_ordering,int32_t num_elements,
          int sparse_rec_method,int has_compression,coda_cdf_variable **variable)

{
  bool bVar1;
  int iVar2;
  coda_cdf_variable *type_00;
  coda_cdf_type *pcVar3;
  coda_cdf_time *pcVar4;
  coda_type_array *pcVar5;
  int64_t *piVar6;
  int local_64;
  coda_cdf_time *special_type;
  int dim_id;
  coda_cdf_time *base_type;
  int local_40;
  int i;
  int time_type;
  int is_scalar;
  coda_cdf_variable *type;
  int32_t *dim_varys_local;
  int32_t *dim_local;
  int32_t num_dims_local;
  int32_t rec_varys_local;
  int32_t max_rec_local;
  int32_t data_type_local;
  
  bVar1 = false;
  local_40 = -1;
  if ((rec_varys == 0) && (max_rec != 0)) {
    __assert_fail("rec_varys || max_rec == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                  ,0x10c,
                  "coda_dynamic_type *coda_cdf_variable_new(int32_t, int32_t, int32_t, int32_t, int32_t *, int32_t *, coda_array_ordering, int32_t, int, int, coda_cdf_variable **)"
                 );
  }
  type_00 = (coda_cdf_variable *)malloc(0x50);
  if (type_00 == (coda_cdf_variable *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x50,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                   ,0x112);
    return (coda_dynamic_type *)0x0;
  }
  type_00->backend = coda_backend_cdf;
  type_00->definition = (coda_type_array *)0x0;
  type_00->tag = tag_cdf_variable;
  type_00->attributes = (coda_mem_record *)0x0;
  type_00->base_type = (coda_cdf_type *)0x0;
  type_00->num_records = 1;
  type_00->num_values_per_record = 1;
  type_00->value_size = -1;
  type_00->sparse_rec_method = sparse_rec_method;
  type_00->has_compression = has_compression;
  type_00->offset = (int64_t *)0x0;
  type_00->data = (int8_t *)0x0;
  if (rec_varys == 0) {
    bVar1 = true;
    for (base_type._4_4_ = 0; base_type._4_4_ < num_dims; base_type._4_4_ = base_type._4_4_ + 1) {
      if (dim_varys[base_type._4_4_] != 0) {
        bVar1 = false;
        break;
      }
    }
  }
  if ((data_type == 0x1f) || (rec_varys_local = data_type, data_type == 0x21)) {
    local_40 = data_type;
    if (data_type == 0x1f) {
      rec_varys_local = 0x2d;
    }
    else {
      rec_varys_local = 8;
    }
  }
  if (bVar1) {
    iVar2 = basic_type_init((coda_cdf_type *)type_00,rec_varys_local,num_elements);
    if (iVar2 != 0) {
      coda_cdf_type_delete((coda_dynamic_type *)type_00);
      return (coda_dynamic_type *)0x0;
    }
    type_00->value_size = (int)(type_00->definition->bit_size / 8);
  }
  else {
    pcVar3 = basic_type_new(rec_varys_local,num_elements);
    type_00->base_type = pcVar3;
    if (type_00->base_type == (coda_cdf_type *)0x0) {
      coda_cdf_type_delete((coda_dynamic_type *)type_00);
      return (coda_dynamic_type *)0x0;
    }
    if (local_40 != -1) {
      pcVar4 = time_type_new(local_40,type_00->base_type);
      if (pcVar4 == (coda_cdf_time *)0x0) {
        coda_cdf_type_delete((coda_dynamic_type *)type_00);
        return (coda_dynamic_type *)0x0;
      }
      type_00->base_type = (coda_cdf_type *)pcVar4;
    }
    pcVar5 = coda_type_array_new(coda_format_cdf);
    type_00->definition = pcVar5;
    if (type_00->definition == (coda_type_array *)0x0) {
      coda_cdf_type_delete((coda_dynamic_type *)type_00);
      return (coda_dynamic_type *)0x0;
    }
    iVar2 = coda_type_array_set_base_type(type_00->definition,type_00->base_type->definition);
    if (iVar2 != 0) {
      coda_cdf_type_delete((coda_dynamic_type *)type_00);
      return (coda_dynamic_type *)0x0;
    }
    if (rec_varys != 0) {
      iVar2 = coda_type_array_add_fixed_dimension(type_00->definition,(long)(max_rec + 1));
      if (iVar2 != 0) {
        coda_cdf_type_delete((coda_dynamic_type *)type_00);
        return (coda_dynamic_type *)0x0;
      }
      type_00->num_records = max_rec + 1;
    }
    type_00->value_size = (int)(type_00->base_type->definition->bit_size / 8);
    for (base_type._4_4_ = 0; base_type._4_4_ < num_dims; base_type._4_4_ = base_type._4_4_ + 1) {
      if (array_ordering == coda_array_ordering_c) {
        local_64 = base_type._4_4_;
      }
      else {
        local_64 = (num_dims + -1) - base_type._4_4_;
      }
      if (dim_varys[local_64] != 0) {
        iVar2 = coda_type_array_add_fixed_dimension(type_00->definition,(long)dim[local_64]);
        if (iVar2 != 0) {
          coda_cdf_type_delete((coda_dynamic_type *)type_00);
          return (coda_dynamic_type *)0x0;
        }
        type_00->num_values_per_record = dim[local_64] * type_00->num_values_per_record;
      }
    }
    iVar2 = coda_type_array_validate(type_00->definition);
    if (iVar2 != 0) {
      coda_cdf_type_delete((coda_dynamic_type *)type_00);
      return (coda_dynamic_type *)0x0;
    }
  }
  piVar6 = (int64_t *)malloc((long)type_00->num_records << 3);
  type_00->offset = piVar6;
  if (type_00->offset == (int64_t *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                   (long)type_00->num_records << 3,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                   ,0x189);
    coda_cdf_type_delete((coda_dynamic_type *)type_00);
    _max_rec_local = (coda_cdf_variable *)0x0;
  }
  else {
    for (base_type._4_4_ = 0; base_type._4_4_ < type_00->num_records;
        base_type._4_4_ = base_type._4_4_ + 1) {
      type_00->offset[base_type._4_4_] = -1;
    }
    *variable = type_00;
    _max_rec_local = type_00;
    if (((bVar1) && (local_40 != -1)) &&
       (_max_rec_local = (coda_cdf_variable *)time_type_new(local_40,(coda_cdf_type *)type_00),
       _max_rec_local == (coda_cdf_variable *)0x0)) {
      coda_cdf_type_delete((coda_dynamic_type *)type_00);
      _max_rec_local = (coda_cdf_variable *)0x0;
    }
  }
  return (coda_dynamic_type *)_max_rec_local;
}

Assistant:

coda_dynamic_type *coda_cdf_variable_new(int32_t data_type, int32_t max_rec, int32_t rec_varys, int32_t num_dims,
                                         int32_t dim[CODA_MAX_NUM_DIMS], int32_t dim_varys[CODA_MAX_NUM_DIMS],
                                         coda_array_ordering array_ordering, int32_t num_elements,
                                         int sparse_rec_method, int has_compression, coda_cdf_variable **variable)
{
    coda_cdf_variable *type;
    int is_scalar = 0;
    int time_type = -1;
    int i;

    assert(rec_varys || max_rec == 0);

    type = (coda_cdf_variable *)malloc(sizeof(coda_cdf_variable));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_cdf_variable), __FILE__, __LINE__);
        return NULL;
    }
    type->backend = coda_backend_cdf;
    type->definition = NULL;
    type->tag = tag_cdf_variable;
    type->attributes = NULL;
    type->base_type = NULL;
    type->num_records = 1;
    type->num_values_per_record = 1;
    type->value_size = -1;
    type->sparse_rec_method = sparse_rec_method;
    type->has_compression = has_compression;
    type->offset = NULL;
    type->data = NULL;

    if (!rec_varys)
    {
        is_scalar = 1;
        for (i = 0; i < num_dims; i++)
        {
            if (dim_varys[i])
            {
                is_scalar = 0;
                break;
            }
        }
    }
    if (data_type == 31 || data_type == 33)
    {
        time_type = data_type;
        if (data_type == 31)
        {
            /* EPOCH */
            data_type = 45;
        }
        else
        {
            /* TIME_TT2000 */
            data_type = 8;
        }
    }

    if (is_scalar)
    {
        if (basic_type_init((coda_cdf_type *)type, data_type, num_elements) != 0)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        type->value_size = (int)(type->definition->bit_size / 8);
    }
    else
    {
        type->base_type = basic_type_new(data_type, num_elements);
        if (type->base_type == NULL)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        if (time_type != -1)
        {
            coda_cdf_time *base_type;

            base_type = time_type_new(time_type, type->base_type);
            if (base_type == NULL)
            {
                coda_cdf_type_delete((coda_dynamic_type *)type);
                return NULL;
            }
            type->base_type = (coda_cdf_type *)base_type;
        }
        type->definition = coda_type_array_new(coda_format_cdf);
        if (type->definition == NULL)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        if (coda_type_array_set_base_type(type->definition, type->base_type->definition) != 0)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        if (rec_varys)
        {
            if (coda_type_array_add_fixed_dimension(type->definition, max_rec + 1) != 0)
            {
                coda_cdf_type_delete((coda_dynamic_type *)type);
                return NULL;
            }
            type->num_records = max_rec + 1;
        }
        type->value_size = (int)(type->base_type->definition->bit_size / 8);
        for (i = 0; i < num_dims; i++)
        {
            /* make sure that we always add the dimensions using C array ordering */
            int dim_id = (array_ordering == coda_array_ordering_c ? i : num_dims - 1 - i);

            if (dim_varys[dim_id])
            {
                if (coda_type_array_add_fixed_dimension(type->definition, dim[dim_id]) != 0)
                {
                    coda_cdf_type_delete((coda_dynamic_type *)type);
                    return NULL;
                }
                type->num_values_per_record *= dim[dim_id];
            }
        }
        if (coda_type_array_validate(type->definition) != 0)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
    }

    type->offset = malloc(type->num_records * sizeof(int64_t));
    if (type->offset == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       type->num_records * sizeof(int64_t), __FILE__, __LINE__);
        coda_cdf_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    for (i = 0; i < type->num_records; i++)
    {
        type->offset[i] = -1;
    }

    *variable = type;

    if (is_scalar && time_type != -1)
    {
        coda_cdf_time *special_type;

        special_type = time_type_new(time_type, (coda_cdf_type *)type);
        if (special_type == NULL)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        return (coda_dynamic_type *)special_type;
    }

    return (coda_dynamic_type *)type;
}